

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O0

la_proto_node * la_miam_core_pdu_parse(char *txt)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  byte *__ptr;
  uint *puVar8;
  la_proto_node *plVar9;
  code *pcVar10;
  la_proto_node *plVar11;
  char *in_RDI;
  la_base85_decode_result lVar12;
  la_miam_core_pdu_parse_f *pdu_parse;
  la_dict *pdu_parse_dict;
  la_proto_node *node;
  uint8_t pdu_type;
  uint8_t version;
  uint8_t *b;
  char *end;
  la_base85_decode_result body;
  int bodylen;
  uint8_t *bodybuf;
  la_base85_decode_result header;
  char *delim;
  char hpad;
  char bpad;
  la_miam_core_pdu *pdu;
  la_dict *local_90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  uint8_t *local_58;
  char *in_stack_ffffffffffffffb0;
  int iVar13;
  uint8_t *file;
  undefined4 in_stack_ffffffffffffffd4;
  
  sVar6 = strlen(in_RDI);
  if (sVar6 < 3) {
    return (la_proto_node *)0x0;
  }
  cVar1 = *in_RDI;
  cVar2 = in_RDI[1];
  if ((((cVar1 < '0') || ('3' < cVar1)) && (cVar1 != '-')) && (cVar1 != '.')) {
    return (la_proto_node *)0x0;
  }
  if ((cVar2 < '0') || ('3' < cVar2)) {
    return (la_proto_node *)0x0;
  }
  pcVar7 = strchr(in_RDI + 2,0x7c);
  if (pcVar7 == (char *)0x0) {
    return (la_proto_node *)0x0;
  }
  if (pcVar7 == in_RDI + 2) {
    return (la_proto_node *)0x0;
  }
  lVar12 = la_base85_decode(in_stack_ffffffffffffffa0,
                            (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  __ptr = lVar12.buf;
  iVar5 = lVar12.len;
  if ((__ptr == (byte *)0x0) || (iVar5 < (char)(cVar2 + -0x30))) {
    return (la_proto_node *)0x0;
  }
  file = (uint8_t *)0x0;
  iVar13 = 0;
  memset(&local_58,0,0x10);
  if (pcVar7[1] != '\0') {
    if ((cVar1 < '0') || ('3' < cVar1)) {
      if (cVar1 == '-') {
        file = (uint8_t *)(pcVar7 + 1);
        sVar6 = strlen(pcVar7 + 1);
        iVar13 = (int)sVar6;
      }
    }
    else {
      pcVar7 = strchr(pcVar7,0);
      lVar12 = la_base85_decode(pcVar7,(char *)CONCAT44(in_stack_ffffffffffffff9c,
                                                        in_stack_ffffffffffffff98));
      local_58 = lVar12.buf;
      iVar13 = lVar12.len;
      in_stack_ffffffffffffffb0 = (char *)CONCAT44(in_stack_ffffffffffffff9c,iVar13);
      if ((local_58 != (uint8_t *)0x0) && ((char)(cVar1 + -0x30) <= iVar13)) {
        in_stack_ffffffffffffffb0 =
             (char *)CONCAT44(in_stack_ffffffffffffff9c,iVar13 - (char)(cVar1 + -0x30));
      }
      iVar13 = (int)in_stack_ffffffffffffffb0;
      file = local_58;
    }
  }
  iVar5 = iVar5 - (char)(cVar2 + -0x30);
  bVar4 = *__ptr & 0xf;
  bVar3 = *__ptr;
  puVar8 = (uint *)la_xcalloc(CONCAT44(in_stack_ffffffffffffffd4,iVar5),(size_t)__ptr,(char *)file,
                              iVar13,in_stack_ffffffffffffffb0);
  puVar8[2] = 4;
  *(byte *)(puVar8 + 1) = bVar4;
  plVar9 = la_proto_node_new();
  plVar9->td = &la_DEF_miam_core_pdu;
  plVar9->data = puVar8;
  plVar9->next = (la_proto_node *)0x0;
  if (bVar4 == 1) {
    local_90 = la_miam_core_v1_pdu_parser_table;
  }
  else {
    if (bVar4 != 2) {
      *puVar8 = *puVar8 | 4;
      goto LAB_0017db94;
    }
    local_90 = la_miam_core_v2_pdu_parser_table;
  }
  pcVar10 = (code *)la_dict_search(local_90,(int)(uint)bVar3 >> 4);
  if (pcVar10 == (code *)0x0) {
    *puVar8 = *puVar8 | 2;
  }
  else {
    puVar8[2] = (int)(uint)bVar3 >> 4;
    plVar11 = (la_proto_node *)(*pcVar10)(__ptr,iVar5,file,iVar13);
    plVar9->next = plVar11;
  }
LAB_0017db94:
  free(__ptr);
  free(local_58);
  return plVar9;
}

Assistant:

la_proto_node *la_miam_core_pdu_parse(char const *txt) {
	la_assert(txt != NULL);

	// Determine if it's a MIAM CORE PDU - check body/header padding counts and look for header/body delimiter
	if(strlen(txt) < 3) {
		return NULL;
	}
	la_miam_core_pdu *pdu = NULL;

	char bpad = txt[0];     // valid values: 0, 1, 2, 3, -, .
	char hpad = txt[1];     // valid values: 0, 1, 2, 3
	txt += 2;
	if(!((bpad >= '0' && bpad <= '3') || bpad == '-' || bpad == '.')) {
		la_debug_print(D_INFO, "Invalid body padding: %c\n", bpad);
		return NULL;
	}
	if(!(hpad >= '0' && hpad <= '3')) {
		la_debug_print(D_INFO, "Invalid header padding: %c\n", hpad);
		return NULL;
	}
	hpad -= 0x30;           // get digit value: '1' -> 1
	char *delim = strchr(txt, '|');
	if(delim == NULL) {
		la_debug_print(D_ERROR, "Header/body delimiter not found\n");
		return NULL;
	}
	if(delim == txt) {
		la_debug_print(D_ERROR, "Empty header\n");
		return NULL;
	}
	// Assume the initial part is the Header - try to decode it
	la_base85_decode_result header = la_base85_decode(txt, delim);
	if(header.buf == NULL || header.len < hpad) { // BASE85 decoder failed or result too short
		return NULL;
	}
	la_debug_print_buf_hex(D_VERBOSE, header.buf, header.len, "Decoded header:\n");

	// Decode message body, if exists and if it's encoded
	uint8_t *bodybuf = NULL;
	int bodylen = 0;
	la_base85_decode_result body = { .buf = NULL, .len = 0 };
	if(delim[1] != '\0') {
		if(bpad >= '0' && bpad <= '3') {
			char *end = strchr(delim, '\0');
			body = la_base85_decode(delim + 1, end);
			bpad -= 0x30;               // get digit value: '1' -> 1
			if(body.buf != NULL && body.len >= bpad) {
				body.len -= bpad;       // cut off padding bytes
			}
			bodybuf = body.buf;
			bodylen = body.len;
		} else if(bpad == '-') {
			// Payload not encoded - just point at the start of it
			bodybuf = (uint8_t *)delim + 1;
			bodylen = strlen(delim + 1);
		}
	}

	// From now on we assume that this is a MIAM frame and we return a non-NULL PDU with an
	// error code if something goes wrong, so that a proper error message is printed to the output.
	uint8_t *b = header.buf;
	header.len -= hpad;                 // cut off padding bytes

	uint8_t version = b[0] & 0xf;
	uint8_t pdu_type = (b[0] >> 4) & 0xf;
	la_debug_print(D_INFO, "ver: %u pdu_type: %u\n", version, pdu_type);

	pdu = LA_XCALLOC(1, sizeof(la_miam_core_pdu));
	pdu->pdu_type = LA_MIAM_CORE_PDU_UNKNOWN;
	pdu->version = version;

	la_proto_node *node = la_proto_node_new();
	node->td = &la_DEF_miam_core_pdu;
	node->data = pdu;
	node->next = NULL;

	la_dict const *pdu_parse_dict = NULL;
	if(version == 1) {
		pdu_parse_dict = la_miam_core_v1_pdu_parser_table;
	} else if(version == 2) {
		pdu_parse_dict = la_miam_core_v2_pdu_parser_table;
	} else {
		la_debug_print(D_ERROR, "Unknown version %u\n", version);
		pdu->err |= LA_MIAM_ERR_HDR_PDU_VERSION_UNKNOWN;
		goto end;
	}

	la_miam_core_pdu_parse_f *pdu_parse = la_dict_search(pdu_parse_dict, pdu_type);
	if(pdu_parse == NULL) {
		la_debug_print(D_ERROR, "No parser for PDU type %u\n", pdu_type);
		pdu->err |= LA_MIAM_ERR_HDR_PDU_TYPE_UNKNOWN;
		goto end;
	}

	pdu->pdu_type = pdu_type;
	node->next = pdu_parse(header.buf, header.len, bodybuf, bodylen);

end:
	LA_XFREE(header.buf);
	LA_XFREE(body.buf);
	return node;
}